

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.hpp
# Opt level: O2

bool __thiscall
cpptrace::detail::libdwarf::die_object::has_attr(die_object *this,Dwarf_Half attr_num)

{
  source_location location;
  int iVar1;
  undefined4 uStack_18;
  Dwarf_Bool present;
  Dwarf_Error local_10;
  
  present = 0;
  local_10 = (Dwarf_Error)0x0;
  iVar1 = dwarf_hasattr(this->die,attr_num,&present,&local_10);
  if (iVar1 != 1) {
    location.file._4_4_ = present;
    location.file._0_4_ = uStack_18;
    location._8_8_ = local_10;
    assert_impl<bool>((detail *)(ulong)(iVar1 == 0),true,0x18328d,
                      "bool cpptrace::detail::libdwarf::die_object::has_attr(Dwarf_Half) const",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O2/_deps/cpptrace-src/src/symbols/dwarf/dwarf.hpp"
                      ,location);
    return present != 0;
  }
  handle_dwarf_error(this->dbg,local_10);
}

Assistant:

bool has_attr(Dwarf_Half attr_num) const {
            Dwarf_Bool present = false;
            VERIFY(wrap(dwarf_hasattr, die, attr_num, &present) == DW_DLV_OK);
            return present;
        }